

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_replace_allocator
              (uv_malloc_func malloc_func,uv_realloc_func realloc_func,uv_calloc_func calloc_func,
              uv_free_func free_func)

{
  int iVar1;
  
  iVar1 = -0x16;
  if ((free_func != (uv_free_func)0x0 && calloc_func != (uv_calloc_func)0x0) &&
      (realloc_func != (uv_realloc_func)0x0 && malloc_func != (uv_malloc_func)0x0)) {
    iVar1 = 0;
    uv__allocator_0 = malloc_func;
    uv__allocator_1 = realloc_func;
    uv__allocator_2 = calloc_func;
    uv__allocator_3 = free_func;
  }
  return iVar1;
}

Assistant:

int uv_replace_allocator(uv_malloc_func malloc_func,
                         uv_realloc_func realloc_func,
                         uv_calloc_func calloc_func,
                         uv_free_func free_func) {
  if (malloc_func == NULL || realloc_func == NULL ||
      calloc_func == NULL || free_func == NULL) {
    return UV_EINVAL;
  }

  uv__allocator.local_malloc = malloc_func;
  uv__allocator.local_realloc = realloc_func;
  uv__allocator.local_calloc = calloc_func;
  uv__allocator.local_free = free_func;

  return 0;
}